

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::RgbaInputFile::FromYca::rotateBuf2(FromYca *this,int d)

{
  int iVar1;
  int i;
  long lVar2;
  Rgba *tmp [3];
  
  iVar1 = Imath_2_5::modp(d,3);
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    tmp[lVar2] = this->_buf2[lVar2];
  }
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    this->_buf2[lVar2] = tmp[(iVar1 + (int)lVar2) % 3];
  }
  return;
}

Assistant:

void
RgbaInputFile::FromYca::rotateBuf2 (int d)
{
    d = modp (d, 3);

    Rgba *tmp[3];

    for (int i = 0; i < 3; ++i)
	tmp[i] = _buf2[i];

    for (int i = 0; i < 3; ++i)
	_buf2[i] = tmp[(i + d) % 3];
}